

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

int duckdb_brotli::CopyFromCompoundDictionary(BrotliDecoderStateInternal *s,int pos)

{
  BrotliDecoderCompoundDictionary *pBVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  pBVar1 = s->compound_dictionary;
  iVar5 = pBVar1->br_copied;
  iVar4 = pos;
  do {
    iVar6 = pBVar1->br_length - iVar5;
    if (iVar6 == 0) break;
    lVar2 = (long)pBVar1->br_index;
    iVar5 = s->ringbuffer_size - iVar4;
    iVar3 = pBVar1->chunk_offsets[lVar2 + 1] - (pBVar1->chunk_offsets[lVar2] + pBVar1->br_offset);
    if (iVar3 <= iVar6) {
      iVar6 = iVar3;
    }
    if (iVar5 <= iVar6) {
      iVar6 = iVar5;
    }
    switchD_01939fa4::default
              (s->ringbuffer + iVar4,pBVar1->chunks[lVar2] + pBVar1->br_offset,(long)iVar6);
    pBVar1->br_offset = pBVar1->br_offset + iVar6;
    iVar5 = pBVar1->br_copied + iVar6;
    pBVar1->br_copied = iVar5;
    if (iVar6 == iVar3) {
      pBVar1->br_index = pBVar1->br_index + 1;
      pBVar1->br_offset = 0;
    }
    iVar4 = iVar4 + iVar6;
  } while (iVar4 != s->ringbuffer_size);
  return iVar4 - pos;
}

Assistant:

static int CopyFromCompoundDictionary(BrotliDecoderState *s, int pos) {
	BrotliDecoderCompoundDictionary *addon = s->compound_dictionary;
	int orig_pos = pos;
	while (addon->br_length != addon->br_copied) {
		uint8_t *copy_dst = &s->ringbuffer[pos];
		const uint8_t *copy_src = addon->chunks[addon->br_index] + addon->br_offset;
		int space = s->ringbuffer_size - pos;
		int rem_chunk_length =
		    (addon->chunk_offsets[addon->br_index + 1] - addon->chunk_offsets[addon->br_index]) - addon->br_offset;
		int length = addon->br_length - addon->br_copied;
		if (length > rem_chunk_length)
			length = rem_chunk_length;
		if (length > space)
			length = space;
		memcpy(copy_dst, copy_src, (size_t)length);
		pos += length;
		addon->br_offset += length;
		addon->br_copied += length;
		if (length == rem_chunk_length) {
			addon->br_index++;
			addon->br_offset = 0;
		}
		if (pos == s->ringbuffer_size)
			break;
	}
	return pos - orig_pos;
}